

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.cc
# Opt level: O2

QPDFObjectHandle __thiscall QPDFOutlineObjectHelper::getDestPage(QPDFOutlineObjectHelper *this)

{
  bool bVar1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar3;
  QPDFObjectHandle dest;
  
  getDest((QPDFOutlineObjectHelper *)&stack0xffffffffffffffe0);
  bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&stack0xffffffffffffffe0);
  if (bVar1) {
    iVar2 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)&stack0xffffffffffffffe0);
    if (0 < iVar2) {
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)this,(int)&stack0xffffffffffffffe0);
      goto LAB_001a357a;
    }
  }
  QPDFObjectHandle::newNull();
LAB_001a357a:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFOutlineObjectHelper::getDestPage()
{
    QPDFObjectHandle dest = getDest();
    if ((dest.isArray()) && (dest.getArrayNItems() > 0)) {
        return dest.getArrayItem(0);
    }
    return QPDFObjectHandle::newNull();
}